

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void set_counting_callbacks(secp256k1_context *ctx0,int *ecount)

{
  secp256k1_context *in_RSI;
  _func_void_char_ptr_void_ptr *in_stack_ffffffffffffffe8;
  
  secp256k1_context_set_error_callback(in_RSI,in_stack_ffffffffffffffe8,(void *)0x15ae24);
  secp256k1_context_set_illegal_callback(in_RSI,in_stack_ffffffffffffffe8,(void *)0x15ae3a);
  return;
}

Assistant:

static void set_counting_callbacks(secp256k1_context *ctx0, int *ecount) {
    secp256k1_context_set_error_callback(ctx0, counting_illegal_callback_fn, ecount);
    secp256k1_context_set_illegal_callback(ctx0, counting_illegal_callback_fn, ecount);
}